

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

FlattenLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_flatten(NeuralNetworkLayer *this)

{
  ulong uVar1;
  FlattenLayerParams *pFVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x12d) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x12d;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pFVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FlattenLayerParams>
                       (arena);
    (this->layer_).flatten_ = pFVar2;
  }
  return (FlattenLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::FlattenLayerParams* NeuralNetworkLayer::_internal_mutable_flatten() {
  if (!_internal_has_flatten()) {
    clear_layer();
    set_has_flatten();
    layer_.flatten_ = CreateMaybeMessage< ::CoreML::Specification::FlattenLayerParams >(GetArenaForAllocation());
  }
  return layer_.flatten_;
}